

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O3

uint64_t __thiscall
MILBlob::Blob::FileWriter::AppendData
          (FileWriter *this,Span<const_unsigned_char,_18446744073709551615UL> data)

{
  long lVar1;
  runtime_error *this_00;
  ulong uVar2;
  
  std::istream::seekg((long)this,_S_beg);
  lVar1 = std::istream::tellg();
  uVar2 = lVar1 + 0x3fU & 0xffffffffffffffc0;
  std::ostream::seekp((long)&this->field_0x10,(_Ios_Seekdir)uVar2);
  std::ostream::write(&this->field_0x10,(long)data.m_ptr);
  if (*(int *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18)) == 0) {
    return uVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"[MIL FileWriter]: Unknown error occurred while writing data to the file.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t FileWriter::AppendData(Span<const uint8_t> data)
{
    auto offset = GetNextAlignedOffset();
    m_fileStream.seekp(static_cast<std::streamoff>(offset), std::ios::beg);
    m_fileStream.write(reinterpret_cast<const char*>(data.Data()), static_cast<std::streamsize>(data.Size()));
    MILVerifyIsTrue(m_fileStream.good(),
                    std::runtime_error,
                    "[MIL FileWriter]: Unknown error occurred while writing data to the file.");
    return offset;
}